

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

iterator __thiscall
nestl::impl::detail::
rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
::m_lower_bound(rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
                *this,link_type x,link_type y,void **k)

{
  bool bVar1;
  void **ppvVar2;
  void **k_local;
  link_type y_local;
  link_type x_local;
  rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
  *this_local;
  
  k_local = (void **)y;
  y_local = x;
  while (y_local != (link_type)0x0) {
    ppvVar2 = s_key(y_local);
    bVar1 = std::less<void_*>::operator()((less<void_*> *)this,*ppvVar2,*k);
    if (bVar1) {
      y_local = s_right(&y_local->super_rb_tree_node_base);
    }
    else {
      k_local = (void **)y_local;
      y_local = s_left(&y_local->super_rb_tree_node_base);
    }
  }
  rb_tree_iterator<void_*>::rb_tree_iterator
            ((rb_tree_iterator<void_*> *)&this_local,(link_type)k_local);
  return (iterator)(base_ptr)this_local;
}

Assistant:

typename rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::iterator
rb_tree<Key, Val, KeyOfValue, Compare, Alloc>::m_lower_bound(link_type x, link_type y, const Key& k) NESTL_NOEXCEPT_SPEC
{
    while (x != 0)
    {
        if (!m_impl.m_key_compare(s_key(x), k))
        {
            y = x, x = s_left(x);
        }
        else
        {
            x = s_right(x);
        }
    }
    return iterator(y);
}